

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  size_t __n;
  
  iVar1 = this->tags_size_;
  uVar2 = this->tags_count_;
  if ((int)uVar2 < iVar1) {
    return true;
  }
  iVar6 = 1;
  if (iVar1 != 0) {
    iVar6 = iVar1 * 2;
  }
  __n = (long)iVar6 * 0x10;
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar7 = __n + 8;
  }
  plVar4 = (long *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
  if (plVar4 == (long *)0x0) {
    return false;
  }
  *plVar4 = (long)iVar6;
  memset((Tag *)(plVar4 + 1),0,__n);
  pTVar3 = this->tags_;
  if ((int)uVar2 < 1) {
    if (pTVar3 == (Tag *)0x0) goto LAB_0011b9e1;
  }
  else {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)plVar4 + lVar5 + 8) =
           *(undefined8 *)((long)&pTVar3->simple_tags_ + lVar5);
      *(undefined8 *)((long)plVar4 + lVar5 + 0x10) =
           *(undefined8 *)((long)&pTVar3->simple_tags_size_ + lVar5);
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar2 << 4 != lVar5);
  }
  operator_delete__(&pTVar3[-1].simple_tags_size_);
LAB_0011b9e1:
  this->tags_ = (Tag *)(plVar4 + 1);
  this->tags_size_ = iVar6;
  return true;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}